

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void server::dodamage(clientinfo *target,clientinfo *actor,int damage,int gun,vec *hitpush)

{
  gamestate *this;
  int *piVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  vec *pvVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  teaminfo *ptVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  anon_union_12_3_07544735_for_vec_0 local_40;
  
  piVar1 = &(actor->state).guninfo[gun].damage;
  *piVar1 = *piVar1 + damage;
  if ((((enable_passflag != 0) && (gamemode + 3U < 0x1a && actor != target)) &&
      ((0x55fUL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) == 0)) &&
     (iVar4 = strcmp(actor->team,target->team), iVar4 == 0)) {
    ctfservmode::dopassflagsequence((ctfservmode *)&ctfmode,actor,target);
    return;
  }
  this = &target->state;
  if (nodamage == 0) {
    fpsstate::dodamage(&this->super_fpsstate,damage);
    sendf(-1,1,"ri6",0xc,(ulong)(uint)target->clientnum,(ulong)(uint)actor->clientnum,
          (ulong)(uint)damage,(ulong)(uint)(target->state).super_fpsstate.armour,
          (ulong)(uint)(target->state).super_fpsstate.health);
  }
  if ((target != actor) &&
     (((0x19 < gamemode + 3U || ((0x55fUL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) != 0)) ||
      (iVar4 = strcmp(target->team,actor->team), iVar4 != 0)))) {
    piVar1 = &(actor->state).damage;
    *piVar1 = *piVar1 + damage;
  }
  if (target != actor) {
    bVar3 = vec::iszero(hitpush);
    if (bVar3) goto LAB_00139e9e;
    local_40.field_0.z = (hitpush->field_0).field_0.z;
    local_40._0_8_ = *(undefined8 *)&hitpush->field_0;
    pvVar7 = vec::rescale((vec *)&local_40.field_0,100.0);
    if ((this->super_fpsstate).health < 1) {
      iVar4 = -1;
    }
    else {
      iVar4 = target->ownernum;
    }
    sendf(iVar4,1,"ri7",0xd,(ulong)(uint)target->clientnum,(ulong)(uint)gun,(ulong)(uint)damage,
          (ulong)(uint)(int)(pvVar7->field_0).field_0.x,
          (ulong)(uint)(int)(pvVar7->field_0).field_0.y,
          (ulong)(uint)(int)(pvVar7->field_0).field_0.z);
  }
  clientinfo::setpushed(target);
LAB_00139e9e:
  if ((this->super_fpsstate).health < 1) {
    fVar19 = (target->state).o.field_0.field_0.x - (actor->state).o.field_0.field_0.x;
    fVar20 = (target->state).o.field_0.field_0.y - (actor->state).o.field_0.field_0.y;
    fVar21 = (target->state).o.field_0.field_0.z - (actor->state).o.field_0.field_0.z;
    fVar19 = SQRT(fVar21 * fVar21 + fVar19 * fVar19 + fVar20 * fVar20);
    if (((target != actor) && (700.0 < fVar19)) &&
       ((0 < (int)(fVar19 + 0.5) && ((actor->state).super_fpsstate.aitype == 0)))) {
      pcVar8 = colorname(actor);
      pcVar9 = colorname(target);
      out(3,"\f0%s \f7got a longshot kill on \f6%s \f7(Distance: %d\f7 feet) with a \f1%s",pcVar8,
          pcVar9,(ulong)(uint)(int)(fVar19 + 0.5),guns[gun].name);
    }
    if (((target != actor) && (fVar19 <= 20.0)) && ((actor->state).super_fpsstate.aitype == 0)) {
      pcVar10 = colorname(actor);
      pcVar11 = colorname(target);
      pcVar8 = guns[gun].name;
      iVar4 = strcmp(pcVar8,"fist");
      pcVar9 = "chainsaw";
      if (iVar4 != 0) {
        pcVar9 = pcVar8;
      }
      out(3,"\f0%s \f7got an up close kill on \f6%s \f7with a \f1%s",pcVar10,pcVar11,pcVar9);
    }
    piVar1 = &(target->state).deaths;
    *piVar1 = *piVar1 + 1;
    iVar4 = gamemode;
    if (smode == (long *)0x0) {
      if (target == actor) {
        uVar5 = 0xffffffff;
      }
      else {
        uVar5 = 1;
        if ((gamemode + 3U < 0x1a) && ((0x55fUL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) == 0)) {
          iVar14 = strcmp(target->team,actor->team);
          uVar5 = -(uint)(iVar14 == 0) | 1;
        }
      }
    }
    else {
      uVar5 = (**(code **)(*smode + 0x38))(smode,target,actor);
      iVar4 = gamemode;
    }
    piVar1 = &(actor->state).frags;
    *piVar1 = *piVar1 + uVar5;
    lVar12 = clients;
    uVar15 = iVar4 + 3;
    if (0 < (int)uVar5) {
      iVar4 = 1;
      if ((uVar15 < 0x1a) && ((0x55fUL >> ((ulong)uVar15 & 0x3f) & 1) == 0)) {
        uVar18 = 0;
        uVar16 = (ulong)DAT_00191854;
        if ((int)DAT_00191854 < 1) {
          uVar16 = uVar18;
        }
        iVar4 = 0;
        iVar14 = 0;
        for (; uVar16 != uVar18; uVar18 = uVar18 + 1) {
          iVar6 = strcmp((char *)(*(long *)(lVar12 + uVar18 * 8) + 0x124),actor->team);
          iVar4 = iVar4 + (uint)(iVar6 == 0);
          iVar14 = iVar14 + (uint)(iVar6 != 0);
        }
      }
      else {
        iVar14 = DAT_00191854 - 1;
      }
      iVar6 = 1;
      if (iVar14 < 2) {
        iVar14 = 1;
      }
      (actor->state).effectiveness =
           (float)(int)(iVar4 * uVar5) / (float)iVar14 + (actor->state).effectiveness;
      lVar12 = (long)totalmillis;
      if (lVar12 - (actor->state).lastfragmillis < (long)multifragmillis) {
        iVar6 = (actor->state).multifrags + 1;
      }
      (actor->state).multifrags = iVar6;
      (actor->state).lastfragmillis = lVar12;
    }
    uVar16 = 0;
    if (((uVar15 < 0x1a) && ((0x55fUL >> ((ulong)uVar15 & 0x3f) & 1) == 0)) &&
       (ptVar13 = hashset<teaminfo>::access<char[260]>((hashset<teaminfo> *)&teaminfos,&actor->team)
       , ptVar13 != (teaminfo *)0x0)) {
      uVar5 = uVar5 + ptVar13->frags;
      ptVar13->frags = uVar5;
      uVar16 = (ulong)uVar5;
    }
    sendf(-1,1,"ri5",0xb,(ulong)(uint)target->clientnum,(ulong)(uint)actor->clientnum,
          (ulong)(uint)(actor->state).frags,uVar16);
    if (target != actor && firstblood == '\0') {
      firstblood = '\x01';
      pcVar8 = colorname(actor);
      out(3,"\f0%s \f7drew \f6FIRST BLOOD!",pcVar8);
    }
    if ((target != actor) && ((actor->state).super_fpsstate.aitype == 0)) {
      piVar1 = &(actor->state).spreefrags;
      *piVar1 = *piVar1 + 1;
    }
    if ((minspreefrags <= (target->state).spreefrags) &&
       ((target->state).super_fpsstate.aitype == 0)) {
      pcVar8 = colorname(target);
      uVar2 = spreefinmsg;
      if (target == actor) {
        out(3,"\f0%s \f7%s",pcVar8,spreesuicidemsg);
      }
      else {
        pcVar9 = colorname(actor);
        out(3,"\f0%s\'s \f7%s \f6%s",pcVar8,uVar2,pcVar9);
      }
    }
    (target->state).lastfragmillis = 0;
    (target->state).multifrags = 0;
    (target->state).spreefrags = 0;
    lVar17 = 0x108;
    iVar4 = DAT_001922e4;
    for (lVar12 = 0; lVar12 < iVar4; lVar12 = lVar12 + 1) {
      if ((actor->state).spreefrags == *(int *)(spreemessages + -0x108 + lVar17)) {
        pcVar8 = colorname(actor);
        out(3,"\f0%s \f7%s \f6%s",pcVar8,spreemessages + lVar17 + -0x104,spreemessages + lVar17);
        iVar4 = DAT_001922e4;
      }
      lVar17 = lVar17 + 0x20c;
    }
    (target->position).ulen = 0;
    if (smode != (long *)0x0) {
      (**(code **)(*smode + 0x40))(smode,target,actor);
    }
    (target->state).state = 1;
    iVar4 = gamemillis;
    (target->state).lastdeath = gamemillis;
    if (((gamemode + 3U < 0x1a && target != actor) &&
        ((0x55fUL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) == 0)) &&
       (iVar14 = strcmp(actor->team,target->team), iVar14 == 0)) {
      piVar1 = &(actor->state).teamkills;
      *piVar1 = *piVar1 + 1;
      addteamkill(actor,target,1);
      iVar4 = (target->state).lastdeath;
    }
    (target->state).deadflush = iVar4 + 300;
  }
  return;
}

Assistant:

void dodamage(clientinfo *target, clientinfo *actor, int damage, int gun, const vec &hitpush = vec(0, 0, 0))
    {
        actor->state.guninfo[gun].damage += damage; //damage by gun for #stats
        gamestate &ts = target->state;
        if(enable_passflag && actor!=target && isteam(actor->team, target->team)) {
            ctfmode.dopassflagsequence(actor,target);
            return;
        }
        if(!nodamage) {
            ts.dodamage(damage);
            sendf(-1, 1, "ri6", N_DAMAGE, target->clientnum, actor->clientnum, damage, ts.armour, ts.health);
        }
        if(target!=actor && !isteam(target->team, actor->team)) actor->state.damage += damage;
        if(target==actor) target->setpushed();
        else if(!hitpush.iszero())
        {
            ivec v(vec(hitpush).rescale(DNF));
            sendf(ts.health<=0 ? -1 : target->ownernum, 1, "ri7", N_HITPUSH, target->clientnum, gun, damage, v.x, v.y, v.z);
            target->setpushed();
        }
        if(ts.health<=0)
        {
            //QServ longshot and close up kill (y - depth, z - height, x - left/right)
            float x2 = target->state.o.x;     //target shot x
            float x1 = actor->state.o.x;      //actor shot x
            float y2 = target->state.o.y;     //target shot y
            float y1 = actor->state.o.y;      //actor shot y
            float z2 = target->state.o.z;     //target shot z
            float z1 = actor->state.o.z;      //actor shot z
            
            float d = sqrt(((x2-x1)*(x2-x1))+((y2-y1)*(y2-y1))+((z2-z1)*(z2-z1)));
            int distanceinteger = int(d + 0.5);
            
            //no teamkills, or weird negative float
            if(d > 700.0 && distanceinteger > 0 && actor != target && actor->state.aitype == AI_NONE) {
                out(ECHO_SERV,"\f0%s \f7got a longshot kill on \f6%s \f7(Distance: %d\f7 feet) with a \f1%s", colorname(actor), colorname(target), distanceinteger, guns[gun].name);
            }
            if(d <= 20.0 && actor != target && actor->state.aitype == AI_NONE) {
                out(ECHO_SERV,"\f0%s \f7got an up close kill on \f6%s \f7with a \f1%s", colorname(actor), colorname(target), (!strcmp(guns[gun].name, "fist" )) ? "chainsaw" : guns[gun].name);
            }
            
            target->state.deaths++;
            int fragvalue = smode ? smode->fragvalue(target, actor) : (target==actor || isteam(target->team, actor->team) ? -1 : 1);
            actor->state.frags += fragvalue;
            
            if(fragvalue>0)
            {
                int friends = 0, enemies = 0; // note: friends also includes the fragger
                if(m_teammode) loopv(clients) if(strcmp(clients[i]->team, actor->team)) enemies++; else friends++;
                else { friends = 1; enemies = clients.length()-1; }
                actor->state.effectiveness += fragvalue*friends/float(max(enemies, 1));
                if(totalmillis - actor->state.lastfragmillis < (int64_t)multifragmillis) {
                    actor->state.multifrags++;
                } else {
                    actor->state.multifrags = 1;
                }
                actor->state.lastfragmillis = totalmillis;
            }
            teaminfo *t = m_teammode ? teaminfos.access(actor->team) : NULL;
            if(t) t->frags += fragvalue;
            sendf(-1, 1, "ri5", N_DIED, target->clientnum, actor->clientnum, actor->state.frags, t ? t->frags : 0);
            if(!firstblood && actor != target) { firstblood = true; out(ECHO_SERV, "\f0%s \f7drew \f6FIRST BLOOD!", colorname(actor)); }
            if(actor != target && actor->state.aitype == AI_NONE) actor->state.spreefrags++;
            if(target->state.spreefrags >= minspreefrags && target->state.aitype == AI_NONE) {
                if(actor == target)
                    out(ECHO_SERV, "\f0%s \f7%s", colorname(target), spreesuicidemsg);
                else
                    out(ECHO_SERV, "\f0%s's \f7%s \f6%s", colorname(target), spreefinmsg, colorname(actor));
            }
            target->state.spreefrags = 0;
            target->state.multifrags = 0;
            target->state.lastfragmillis = 0;
            loopv(spreemessages) {
                if(actor->state.spreefrags == spreemessages[i].frags) out(ECHO_SERV, "\f0%s \f7%s \f6%s", colorname(actor), spreemessages[i].msg1, spreemessages[i].msg2);
            }
            target->position.setsize(0);
            if(smode) smode->died(target, actor);
            ts.state = CS_DEAD;
            ts.lastdeath = gamemillis;
            if(actor!=target && isteam(actor->team, target->team))
            {
                actor->state.teamkills++;
                addteamkill(actor, target, 1);
            }
            ts.deadflush = ts.lastdeath + DEATHMILLIS;
            // ts.respawn(); don't issue respawn yet until DEATHMILLIS has elapsed
        }
    }